

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAddMsgIfSpecified(char *msg)

{
  char *msg_local;
  
  if (msg != (char *)0x0) {
    UnityPrint(". ");
    if (Unity.CurrentDetail1 != (char *)0x0) {
      UnityPrint("Function ");
      UnityPrint(Unity.CurrentDetail1);
      if (Unity.CurrentDetail2 != (char *)0x0) {
        UnityPrint(" Argument ");
        UnityPrint(Unity.CurrentDetail2);
      }
      UnityPrint(". ");
    }
    UnityPrint(msg);
  }
  return;
}

Assistant:

static void UnityAddMsgIfSpecified(const char* msg)
{
    if (msg)
    {
        UnityPrint(UnityStrSpacer);

#ifdef UNITY_PRINT_TEST_CONTEXT
        UNITY_PRINT_TEST_CONTEXT();
#endif
#ifndef UNITY_EXCLUDE_DETAILS
        if (Unity.CurrentDetail1)
        {
            UnityPrint(UnityStrDetail1Name);
            UnityPrint(Unity.CurrentDetail1);
            if (Unity.CurrentDetail2)
            {
                UnityPrint(UnityStrDetail2Name);
                UnityPrint(Unity.CurrentDetail2);
            }
            UnityPrint(UnityStrSpacer);
        }
#endif
        UnityPrint(msg);
    }
}